

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O3

SQInteger base_type(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  SQSharedState *ss;
  SQObjectPtr *obj1;
  SQChar *s;
  SQObjectPtr local_20;
  
  obj1 = SQVM::GetAt(v,v->_stackbase + 1);
  ss = v->_sharedstate;
  s = GetTypeName(obj1);
  local_20.super_SQObject._unVal.pString = SQString::Create(ss,s,-1);
  local_20.super_SQObject._type = OT_STRING;
  if (local_20.super_SQObject._unVal.pTable != (SQTable *)0x0) {
    pSVar1 = &((local_20.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
    SQVM::Push(v,&local_20);
    SQObjectPtr::~SQObjectPtr(&local_20);
    return 1;
  }
  __assert_fail("_unVal.pTable",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/DaZombieKiller[P]SqNET/squirrel/squirrel/sqobject.h"
                ,0xea,"SQObjectPtr::SQObjectPtr(SQString *)");
}

Assistant:

static SQInteger base_type(HSQUIRRELVM v)
{
    SQObjectPtr &o = stack_get(v,2);
    v->Push(SQString::Create(_ss(v),GetTypeName(o),-1));
    return 1;
}